

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O2

bool Js::RegexHelper::IsRegexSymbolSplitObservable
               (RecyclableObject *instance,ScriptContext *scriptContext)

{
  DynamicObject *regexPrototype;
  bool bVar1;
  
  regexPrototype =
       (((scriptContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
       regexPrototype.ptr;
  bVar1 = JavascriptRegExp::HasOriginalRegExType(instance);
  if (bVar1) {
    bVar1 = JavascriptRegExp::HasObservableConstructor(regexPrototype);
    if (!bVar1) {
      bVar1 = JavascriptRegExp::HasObservableFlags(regexPrototype);
      if (!bVar1) {
        bVar1 = JavascriptRegExp::HasObservableExec(regexPrototype);
        return bVar1;
      }
    }
  }
  return true;
}

Assistant:

bool RegexHelper::IsRegexSymbolSplitObservable(RecyclableObject* instance, ScriptContext* scriptContext)
    {
        DynamicObject* regexPrototype = scriptContext->GetLibrary()->GetRegExpPrototype();
        return !JavascriptRegExp::HasOriginalRegExType(instance)
            || JavascriptRegExp::HasObservableConstructor(regexPrototype)
            || JavascriptRegExp::HasObservableFlags(regexPrototype)
            || JavascriptRegExp::HasObservableExec(regexPrototype);
    }